

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatdesc.h
# Opt level: O0

void __thiscall FormatDescriptor::removeLastChannel(FormatDescriptor *this)

{
  size_type sVar1;
  long in_RDI;
  uint32_t numChannels;
  
  sVar1 = std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::size
                    ((vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *)
                     (in_RDI + 0x58));
  if ((uint)sVar1 < 2) {
    __assert_fail("numChannels > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./formatdesc.h"
                  ,0x2eb,"void FormatDescriptor::removeLastChannel()");
  }
  if ((int)((*(ulong *)(in_RDI + 8) & 0xff) % (sVar1 & 0xffffffff)) == 0) {
    std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::pop_back
              ((vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *)
               0x27932e);
    *(ulong *)(in_RDI + 8) =
         *(ulong *)(in_RDI + 8) & 0xffffffffffffff00 |
         (ulong)((int)((*(ulong *)(in_RDI + 8) & 0xff) / (sVar1 & 0xffffffff)) * ((uint)sVar1 - 1))
         & 0xff;
    if (*(int *)(in_RDI + 0x10) != 0) {
      *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + -1;
    }
    return;
  }
  __assert_fail("basic.bytesPlane0 % numChannels == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./formatdesc.h"
                ,0x2ec,"void FormatDescriptor::removeLastChannel()");
}

Assistant:

void removeLastChannel() {
        const auto numChannels = static_cast<uint32_t>(samples.size());
        assert(numChannels > 1);
        assert(basic.bytesPlane0 % numChannels == 0);
        samples.pop_back();
        basic.bytesPlane0 = basic.bytesPlane0 / numChannels * (numChannels - 1u);
        if (extended.channelCount != 0)
            --extended.channelCount;
    }